

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.c
# Opt level: O0

int insert_at(quicly_ranges_t *ranges,uint64_t start,uint64_t end,size_t slot)

{
  void *__dest;
  undefined8 *puVar1;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  size_t _n_2;
  size_t _n_1;
  size_t _n;
  quicly_range_t *new_ranges;
  size_t new_capacity;
  long local_68;
  
  if (in_RDI[1] == in_RDI[2]) {
    if ((ulong)in_RDI[2] < 4) {
      local_68 = 4;
    }
    else {
      local_68 = in_RDI[2] << 1;
    }
    __dest = malloc(local_68 << 4);
    if (__dest == (void *)0x0) {
      return 0x201;
    }
    if (in_RCX != 0) {
      memcpy(__dest,(void *)*in_RDI,in_RCX << 4);
    }
    if (in_RDI[1] - in_RCX != 0) {
      memcpy((void *)((long)__dest + in_RCX * 0x10 + 0x10),(void *)(*in_RDI + in_RCX * 0x10),
             (in_RDI[1] - in_RCX) * 0x10);
    }
    if ((long *)*in_RDI != in_RDI + 3) {
      free((void *)*in_RDI);
    }
    *in_RDI = (long)__dest;
    in_RDI[2] = local_68;
  }
  else if (in_RDI[1] - in_RCX != 0) {
    memmove((void *)(*in_RDI + in_RCX * 0x10 + 0x10),(void *)(*in_RDI + in_RCX * 0x10),
            (in_RDI[1] - in_RCX) * 0x10);
  }
  puVar1 = (undefined8 *)(*in_RDI + in_RCX * 0x10);
  *puVar1 = in_RSI;
  puVar1[1] = in_RDX;
  in_RDI[1] = in_RDI[1] + 1;
  return 0;
}

Assistant:

static int insert_at(quicly_ranges_t *ranges, uint64_t start, uint64_t end, size_t slot)
{
    if (ranges->num_ranges == ranges->capacity) {
        size_t new_capacity = ranges->capacity < 4 ? 4 : ranges->capacity * 2;
        quicly_range_t *new_ranges = malloc(new_capacity * sizeof(*new_ranges));
        if (new_ranges == NULL)
            return PTLS_ERROR_NO_MEMORY;
        COPY(new_ranges, ranges->ranges, slot);
        COPY(new_ranges + slot + 1, ranges->ranges + slot, ranges->num_ranges - slot);
        if (ranges->ranges != &ranges->_initial)
            free(ranges->ranges);
        ranges->ranges = new_ranges;
        ranges->capacity = new_capacity;
    } else {
        MOVE(ranges->ranges + slot + 1, ranges->ranges + slot, ranges->num_ranges - slot);
    }
    ranges->ranges[slot] = (quicly_range_t){start, end};
    ++ranges->num_ranges;
    return 0;
}